

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::util_getCoeff(HModel *this,int row,int col,double *val)

{
  uint uVar1;
  pointer piVar2;
  uint uVar3;
  ostream *poVar4;
  uint uVar5;
  int *piVar6;
  double dVar7;
  
  printf("Called model.util_getCoeff(row=%d, col=%d)\n");
  std::ostream::flush();
  poVar4 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  piVar2 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = piVar2[col];
  uVar1 = piVar2[(long)col + 1];
  uVar3 = 0xffffffff;
  if ((int)uVar5 < (int)uVar1) {
    piVar6 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + (int)uVar5;
    do {
      uVar3 = uVar5;
      if (*piVar6 == row) break;
      uVar5 = uVar5 + 1;
      piVar6 = piVar6 + 1;
      uVar3 = 0xffffffff;
    } while (uVar1 != uVar5);
  }
  if ((int)uVar3 < 0) {
    dVar7 = 0.0;
  }
  else {
    dVar7 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar3];
  }
  *val = dVar7;
  return;
}

Assistant:

void HModel::util_getCoeff(int row, int col, double* val) {
  assert(row >= 0 && row < numRow);
  assert(col >= 0 && col < numCol);
#ifdef JAJH_dev
  printf("Called model.util_getCoeff(row=%d, col=%d)\n", row, col);cout << flush;
#endif
  //  printf("Called model.util_getCoeff(row=%d, col=%d)\n", row, col);cout << flush;

  cout << val << endl;


  int get_el = -1;
  for (int el=Astart[col]; el < Astart[col+1]; el++) {
    //  printf("Column %4d: Element %4d is row %4d. Is it %4d?\n", col, el, Aindex[el], row);cout << flush;
  if (Aindex[el] == row) {
  get_el = el;
  break;
}
}
  if (get_el < 0) {
    //  printf("model.util_getCoeff: Cannot find row %d in column %d\n", row, col);cout << flush;
  *val = 0;
} else { 
    //  printf("model.util_getCoeff: Found row %d in column %d as element %d: value %g\n", row, col, get_el, Avalue[get_el]);cout << flush;
  *val = Avalue[get_el];
}
}